

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beatnik.hpp
# Opt level: O0

float_t __thiscall
re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::estimate_tempo
          (beatnik<float,_1024L,_128L,_2048L,_128L> *this)

{
  float local_18;
  float_t bpm;
  float_t period;
  beatnik<float,_1024L,_128L,_2048L,_128L> *this_local;
  
  local_18 = tracker<float,_256L,_4L>::estimate_period(&this->tracker_);
  for (local_18 = this->frames_per_minute / local_18; 180.0 < local_18; local_18 = local_18 / 2.0) {
  }
  for (; local_18 < 90.0; local_18 = local_18 * 2.0) {
  }
  return local_18;
}

Assistant:

float_t
    estimate_tempo() noexcept
    {
        float_t period = tracker_.estimate_period();

        auto bpm = frames_per_minute / period;
        while (bpm > max_tempo) {
            bpm /= 2;
        }
        while (bpm < min_tempo) {
            bpm *= 2;
        }

        return bpm;
    }